

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALboolean alIsExtensionPresent(ALchar *extname)

{
  int iVar1;
  ALboolean local_11;
  ALboolean retval;
  ALchar *extname_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alIsExtensionPresent);
  IO_STRING(extname);
  iVar1 = strcasecmp(extname,"AL_EXT_trace_info");
  if (iVar1 == 0) {
    local_11 = '\x01';
  }
  else {
    local_11 = (*REAL_alIsExtensionPresent)(extname);
  }
  IO_BOOLEAN(local_11);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return local_11;
}

Assistant:

ALboolean alIsExtensionPresent(const ALchar *extname)
{
    ALboolean retval;
    IO_START(alIsExtensionPresent);
    IO_STRING(extname);
    if (strcasecmp(extname, "AL_EXT_trace_info") == 0) {
        retval = AL_TRUE;
    } else {
        retval = REAL_alIsExtensionPresent(extname);
    }
    IO_BOOLEAN(retval);
    IO_END();
    return retval;
}